

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_jp2_header_handler_t * opj_jp2_find_handler(OPJ_UINT32 p_id)

{
  uint local_18;
  OPJ_UINT32 l_handler_size;
  OPJ_UINT32 i;
  OPJ_UINT32 p_id_local;
  
  local_18 = 0;
  while( true ) {
    if (2 < local_18) {
      return (opj_jp2_header_handler_t *)0x0;
    }
    if (jp2_header[local_18].id == p_id) break;
    local_18 = local_18 + 1;
  }
  return jp2_header + local_18;
}

Assistant:

static const opj_jp2_header_handler_t * opj_jp2_find_handler(OPJ_UINT32 p_id)
{
    OPJ_UINT32 i, l_handler_size = sizeof(jp2_header) / sizeof(
                                       opj_jp2_header_handler_t);

    for (i = 0; i < l_handler_size; ++i) {
        if (jp2_header[i].id == p_id) {
            return &jp2_header[i];
        }
    }
    return NULL;
}